

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O0

void __thiscall
tonk::LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_unsigned_int,_tonk::UDPAddressHasher>::
LightHashMap(LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_unsigned_int,_tonk::UDPAddressHasher>
             *this)

{
  LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_unsigned_int,_tonk::UDPAddressHasher>
  *this_local;
  
  this->m_hash_shift = 0x20;
  this->m_num_valid = 0;
  this->m_grow_threshold = 0;
  this->m_values = (raw_node *)0x0;
  this->m_values_count = 0;
  return;
}

Assistant:

inline LightHashMap() {}